

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

Vec_Int_t * Vec_IntStart(int nSize)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = Vec_IntAlloc(nSize);
  pVVar1->nSize = nSize;
  memset(pVVar1->pArray,0,(long)nSize << 2);
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStart( int nSize )
{
    Vec_Int_t * p;
    p = Vec_IntAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(int) * nSize );
    return p;
}